

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype __thiscall QString::count(QString *this,QString *str,CaseSensitivity cs)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  QStringView needle;
  QStringView haystack;
  
  pcVar1 = (this->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    pcVar1 = &_empty;
  }
  pcVar3 = (str->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = &_empty;
  }
  needle.m_data = pcVar3;
  needle.m_size = (str->d).size;
  haystack.m_data = pcVar1;
  haystack.m_size = (this->d).size;
  qVar2 = QtPrivate::count(haystack,needle,cs);
  return qVar2;
}

Assistant:

qsizetype QString::count(const QString &str, Qt::CaseSensitivity cs) const
{
    return QtPrivate::count(QStringView(unicode(), size()), QStringView(str.unicode(), str.size()), cs);
}